

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O3

pair_type __thiscall
booster::locale::gnu_gettext::mo_message<char>::get_string
          (mo_message<char> *this,int domain_id,char_type *context,char_type *in_id)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pmVar3;
  mo_file *this_00;
  ulong uVar4;
  pair_type pVar5;
  pair_type pVar6;
  const_iterator cVar7;
  _Rb_tree<booster::locale::gnu_gettext::message_key<char>,_std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  _Base_ptr p_Var8;
  ulong uVar9;
  char *pcVar10;
  pair_type pVar11;
  pair_type pVar12;
  key_type key;
  key_type local_70;
  
  if (-1 < domain_id) {
    uVar4 = (ulong)(uint)domain_id;
    pmVar3 = (this->catalogs_).
             super__Vector_base<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar9 = ((long)(this->catalogs_).
                   super__Vector_base<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::map<booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pmVar3 >> 4) *
            -0x5555555555555555;
    if (uVar4 <= uVar9 && uVar9 - uVar4 != 0) {
      this_00 = (this->mo_catalogs_).
                super__Vector_base<std::shared_ptr<booster::locale::gnu_gettext::mo_file>,_std::allocator<std::shared_ptr<booster::locale::gnu_gettext::mo_file>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar4].
                super___shared_ptr<booster::locale::gnu_gettext::mo_file,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
      if (this_00 != (mo_file *)0x0) {
        pVar11 = mo_file::find(this_00,context,in_id);
        pVar12.first = pVar11.first;
        pVar12.second = pVar11.second;
        return pVar12;
      }
      paVar1 = &local_70.context_.field_2;
      local_70.context_._M_string_length = 0;
      local_70.context_.field_2._M_local_buf[0] = '\0';
      paVar2 = &local_70.key_.field_2;
      local_70.key_._M_string_length = 0;
      local_70.key_.field_2._M_local_buf[0] = '\0';
      if (context == (char_type *)0x0) {
        context = "";
      }
      this_01 = &pmVar3[uVar4]._M_t;
      local_70.context_._M_dataplus._M_p = (pointer)paVar1;
      local_70.key_._M_dataplus._M_p = (pointer)paVar2;
      local_70.c_context_ = context;
      local_70.c_key_ = in_id;
      cVar7 = std::
              _Rb_tree<booster::locale::gnu_gettext::message_key<char>,_std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<booster::locale::gnu_gettext::message_key<char>_>,_std::allocator<std::pair<const_booster::locale::gnu_gettext::message_key<char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(this_01,&local_70);
      if ((_Rb_tree_header *)cVar7._M_node == &(this_01->_M_impl).super__Rb_tree_header) {
        p_Var8 = (_Base_ptr)0x0;
        pcVar10 = (char *)0x0;
      }
      else {
        p_Var8 = cVar7._M_node[3]._M_left;
        pcVar10 = (char *)((long)&p_Var8->_M_color + (long)&(cVar7._M_node[3]._M_right)->_M_color);
      }
      pVar6.second = pcVar10;
      pVar6.first = (char *)p_Var8;
      pVar5.second = pcVar10;
      pVar5.first = (char *)p_Var8;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.key_._M_dataplus._M_p != paVar2) {
        operator_delete(local_70.key_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.context_._M_dataplus._M_p == paVar1) {
        return pVar5;
      }
      operator_delete(local_70.context_._M_dataplus._M_p);
      return pVar6;
    }
  }
  return (pair_type)ZEXT816(0);
}

Assistant:

pair_type get_string(int domain_id,char_type const *context,char_type const *in_id) const
                {
                    pair_type null_pair((CharType const *)0,(CharType const *)0);
                    if(domain_id < 0 || size_t(domain_id) >= catalogs_.size())
                        return null_pair;
                    if(mo_file_use_traits<char_type>::in_use && mo_catalogs_[domain_id]) {
                        return mo_file_use_traits<char_type>::use(*mo_catalogs_[domain_id],context,in_id);
                    }
                    else {
                        key_type key(context,in_id);
                        catalog_type const &cat = catalogs_[domain_id];
                        typename catalog_type::const_iterator p = cat.find(key);
                        if(p==cat.end()) {
                            return null_pair;
                        }
                        return pair_type(p->second.data(),p->second.data()+p->second.size());
                    }
                }